

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Input_.cxx
# Opt level: O2

int __thiscall Fl_Input_::word_end(Fl_Input_ *this,int i)

{
  int iVar1;
  char *pcVar2;
  int in_EDX;
  int extraout_EDX;
  int extraout_EDX_00;
  
  if (((this->super_Fl_Widget).type_ & 7) == 5) {
    return this->size_;
  }
  for (; i < this->size_; i = i + 1) {
    pcVar2 = index(this,(char *)(ulong)(uint)i,in_EDX);
    iVar1 = isword((char)pcVar2);
    in_EDX = extraout_EDX;
    if (iVar1 != 0) break;
  }
  while( true ) {
    if (this->size_ <= i) {
      return i;
    }
    pcVar2 = index(this,(char *)(ulong)(uint)i,in_EDX);
    iVar1 = isword((char)pcVar2);
    if (iVar1 == 0) break;
    i = i + 1;
    in_EDX = extraout_EDX_00;
  }
  return i;
}

Assistant:

int Fl_Input_::word_end(int i) const {
  if (input_type() == FL_SECRET_INPUT) return size();
  while (i < size() && !isword(index(i))) i++;
  while (i < size() && isword(index(i))) i++;
  return i;
}